

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void mbc3_write_ext_ram(Emulator *e,MaskedAddress addr,u8 value)

{
  Bool BVar1;
  byte bVar2;
  Bool BVar3;
  Ticks TVar4;
  
  if ((e->state).memory_map_state.ext_ram_enabled != FALSE) {
    bVar2 = (e->state).memory_map_state.field_3.mbc3.rtc_reg;
    if (bVar2 < 4) {
      gb_write_ext_ram(e,addr,value);
      return;
    }
    if ((e->state).memory_map_state.field_3.mbc3.latched != FALSE) {
      switch(bVar2) {
      case 8:
        (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff = value & 0x3f;
        if ((e->state).memory_map_state.field_3.mbc3.rtc_halt == FALSE) {
          TVar4 = (e->state).ticks;
        }
        else {
          TVar4 = 0;
        }
        break;
      case 9:
        (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff = value & 0x3f;
        return;
      case 10:
        (e->state).memory_map_state.field_3.mbc3.hour = value & 0x1f;
        return;
      case 0xb:
        (e->state).memory_map_state.field_3.mbc3.day =
             (ushort)value | (e->state).memory_map_state.field_3.mbc3.day & 0x100;
        return;
      case 0xc:
        *(byte *)((long)&(e->state).memory_map_state.field_3 + 5) = value & 1;
        *(uint *)((long)&(e->state).memory_map_state.field_3 + 8) = (uint)(value >> 7);
        BVar3 = value >> 6 & TRUE;
        BVar1 = (e->state).memory_map_state.field_3.mbc3.rtc_halt;
        (e->state).memory_map_state.field_3.mbc3.rtc_halt = BVar3;
        if (BVar3 == BVar1) {
          return;
        }
        TVar4 = (e->state).ticks - (e->state).memory_map_state.field_3.mbc3.latch_ticks;
        break;
      default:
        goto switchD_0018ef99_default;
      }
      (e->state).memory_map_state.field_3.mbc3.latch_ticks = TVar4;
    }
  }
switchD_0018ef99_default:
  return;
}

Assistant:

static void mbc3_write_ext_ram(Emulator* e, MaskedAddress addr, u8 value) {
  if (!MMAP_STATE.ext_ram_enabled) {
    return;
  }

  Mbc3* mbc3 = &MMAP_STATE.mbc3;
  if (mbc3->rtc_reg <= 3) {
    gb_write_ext_ram(e, addr, value);
    return;
  }

  if (!mbc3->latched) {
    return;
  }

  switch (mbc3->rtc_reg) {
    case 8:
      mbc3->sec = value & 63;
      /* Reset the tick timer. Note that if the RTC timer is halted then
       * latch_ticks is a previously stored delta, not an absolute tick timer.
       * Once the timer is restarted then latch_ticks is an absolute timer
       * again. */
      mbc3->latch_ticks = mbc3->rtc_halt ? 0 : TICKS;
      break;
    case 9: mbc3->min = value & 63; break;
    case 10: mbc3->hour = value & 31; break;
    case 11: mbc3->day = (mbc3->day & 0x100) | value; break;
    case 12: {
      mbc3->day = (UNPACK(value, MBC3_RTC_DAY_HI) << 8) | (mbc3->day & 0xff);
      mbc3->day_carry = UNPACK(value, MBC3_RTC_DAY_CARRY);
      Bool old_rtc_halt = mbc3->rtc_halt;
      mbc3->rtc_halt = UNPACK(value, MBC3_RTC_HALT);
      if (mbc3->rtc_halt != old_rtc_halt) {
        // Update the tick timer; if the clock is halted, then store the
        // previous delta before the clock was stopped. If the clock is
        // restarted, then subtract that delta from the current tick timer to
        // "add" in the delta that is not yet accounted for in the RTC
        // registers.
        mbc3->latch_ticks = TICKS - mbc3->latch_ticks;
      }
      break;
    }
    default:
      break;
  }
}